

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VertexAttribLocationAPITest::getProgramInterface
          (VertexAttribLocationAPITest *this,GLuint param_1,ProgramInterface *program_interface,
          VaryingPassthrough *param_3)

{
  GLuint GVar1;
  Type *pTVar2;
  reference pvVar3;
  size_type sVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  undefined4 local_54;
  undefined4 local_50;
  GLuint goten_location;
  GLuint goku_location;
  GLuint goku_offset;
  GLuint gohan_offset;
  GLuint goten_offset;
  GLuint chichi_offset;
  GLuint type_size;
  Type *type;
  ShaderInterface *si;
  VaryingPassthrough *param_3_local;
  ProgramInterface *program_interface_local;
  VertexAttribLocationAPITest *pVStack_10;
  GLuint param_1_local;
  VertexAttribLocationAPITest *this_local;
  
  si = (ShaderInterface *)param_3;
  param_3_local = (VaryingPassthrough *)program_interface;
  program_interface_local._4_4_ = param_1;
  pVStack_10 = this;
  type = (Type *)Utils::ProgramInterface::GetShaderInterface(program_interface,VERTEX);
  _chichi_offset = &Utils::Type::vec4;
  goku_offset = Utils::Type::GetSize((Type *)&Utils::Type::vec4);
  gohan_offset = 0;
  goku_location = goku_offset * 2;
  goten_location = goku_offset * 3;
  local_50 = 2;
  local_54 = 6;
  goten_offset = goku_offset;
  Utils::Type::GenerateDataPacked(&local_70,(Type *)&Utils::Type::vec4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_goku_data,&local_70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_70);
  Utils::Type::GenerateDataPacked(&local_88,(Type *)&Utils::Type::vec4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_gohan_data,&local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  Utils::Type::GenerateDataPacked(&local_a0,(Type *)&Utils::Type::vec4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_goten_data,&local_a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a0);
  Utils::Type::GenerateDataPacked(&local_b8,(Type *)&Utils::Type::vec4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->m_chichi_data,&local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_b8);
  std::__cxx11::string::operator=((string *)type,"const uint GOKU_LOCATION = 2;\n");
  pTVar2 = type;
  GVar1 = goten_location;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_goku_data,0);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_goku_data);
  Utils::ShaderInterface::Input<void>
            ((ShaderInterface *)pTVar2,"goku","layout (location = GOKU_LOCATION)",0,2,
             (Type *)&Utils::Type::vec4,'\0',0,0,GVar1,pvVar3,sVar4);
  pTVar2 = type;
  GVar1 = goku_location;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_gohan_data,0);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_gohan_data);
  Utils::ShaderInterface::Input<void>
            ((ShaderInterface *)pTVar2,"gohan","",0,-1,(Type *)&Utils::Type::vec4,'\0',0,0,GVar1,
             pvVar3,sVar4);
  pTVar2 = type;
  GVar1 = goku_offset;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_goten_data,0);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_goten_data);
  Utils::ShaderInterface::Input<void>
            ((ShaderInterface *)pTVar2,"goten","",0,6,(Type *)&Utils::Type::vec4,'\0',0,0,GVar1,
             pvVar3,sVar4);
  pTVar2 = type;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_chichi_data,0);
  sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_chichi_data);
  Utils::ShaderInterface::Input<void>
            ((ShaderInterface *)pTVar2,"chichi","",0,-1,(Type *)&Utils::Type::vec4,'\0',0,0,0,pvVar3
             ,sVar4);
  return;
}

Assistant:

void VertexAttribLocationAPITest::getProgramInterface(GLuint /* test_case_index */,
													  Utils::ProgramInterface& program_interface,
													  Utils::VaryingPassthrough& /* varying_passthrough */)
{
	Utils::ShaderInterface& si		  = program_interface.GetShaderInterface(Utils::Shader::VERTEX);
	const Utils::Type&		type	  = Utils::Type::vec4;
	const GLuint			type_size = type.GetSize();

	/* Offsets */
	const GLuint chichi_offset = 0;
	const GLuint goten_offset  = chichi_offset + type_size;
	const GLuint gohan_offset  = goten_offset + type_size;
	const GLuint goku_offset   = gohan_offset + type_size;

	/* Locations */
	const GLuint goku_location  = 2;
	const GLuint goten_location = m_goten_location;

	/* Generate data */
	m_goku_data   = type.GenerateDataPacked();
	m_gohan_data  = type.GenerateDataPacked();
	m_goten_data  = type.GenerateDataPacked();
	m_chichi_data = type.GenerateDataPacked();

	/* Globals */
	si.m_globals = "const uint GOKU_LOCATION = 2;\n";

	/* Attributes */
	si.Input("goku" /* name */, "layout (location = GOKU_LOCATION)" /* qualifiers */, 0 /* expected_componenet */,
			 goku_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			 0u /* n_array_elements */, 0u /* stride */, goku_offset /* offset */, (GLvoid*)&m_goku_data[0] /* data */,
			 m_goku_data.size() /* data_size */);

	si.Input("gohan" /* name */, "" /* qualifiers */, 0 /* expected_componenet */,
			 Utils::Variable::m_automatic_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			 0u /* n_array_elements */, 0u /* stride */, gohan_offset /* offset */,
			 (GLvoid*)&m_gohan_data[0] /* data */, m_gohan_data.size() /* data_size */);

	si.Input("goten" /* name */, "" /* qualifiers */, 0 /* expected_componenet */,
			 goten_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			 0u /* n_array_elements */, 0u /* stride */, goten_offset /* offset */,
			 (GLvoid*)&m_goten_data[0] /* data */, m_goten_data.size() /* data_size */);

	si.Input("chichi" /* name */, "" /* qualifiers */, 0 /* expected_componenet */,
			 Utils::Variable::m_automatic_location /* expected_location */, type /* type */, GL_FALSE /* normalized */,
			 0u /* n_array_elements */, 0u /* stride */, chichi_offset /* offset */,
			 (GLvoid*)&m_chichi_data[0] /* data */, m_chichi_data.size() /* data_size */);
}